

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

uint32_t crc32_update(uint32_t crc,ptrlen data)

{
  undefined8 local_30;
  size_t len;
  uint8_t *p;
  uint32_t crc_local;
  ptrlen data_local;
  
  local_30 = data.len;
  len = (size_t)data.ptr;
  p._4_4_ = crc;
  while (local_30 != 0) {
    p._4_4_ = crc32_shift_8(p._4_4_ ^ *(byte *)len);
    local_30 = local_30 - 1;
    len = len + 1;
  }
  return p._4_4_;
}

Assistant:

uint32_t crc32_update(uint32_t crc, ptrlen data)
{
    const uint8_t *p = (const uint8_t *)data.ptr;
    for (size_t len = data.len; len-- > 0 ;)
        crc = crc32_shift_8(crc ^ *p++);
    return crc;
}